

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void init_proc_602(CPUPPCState_conflict2 *env)

{
  int nb_ways;
  undefined8 uVar1;
  CPUPPCState_conflict3 *__mptr;
  int in_ESI;
  undefined8 uVar2;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  if ((((env->spr_cb[0x3df].name == (char *)0x0) && (env->spr[0x3df] == 0)) &&
      (env->spr_cb[0x3df].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3df].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3df].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3df].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3df].name = "SER";
    env->spr_cb[0x3df].uea_read = spr_noaccess;
    env->spr_cb[0x3df].uea_write = spr_noaccess;
    env->spr_cb[0x3df].oea_read = spr_read_generic;
    env->spr_cb[0x3df].oea_write = spr_write_generic;
    env->spr_cb[0x3df].hea_read = spr_read_generic;
    env->spr_cb[0x3df].hea_write = spr_write_generic;
    env->spr_cb[0x3df].default_value = 0;
    env->spr[0x3df] = 0;
    if (((env->spr_cb[0x3de].name == (char *)0x0) && (env->spr[0x3de] == 0)) &&
       ((env->spr_cb[0x3de].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3de].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3de].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3de].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3de].name = "SEBR";
      env->spr_cb[0x3de].uea_read = spr_noaccess;
      env->spr_cb[0x3de].uea_write = spr_noaccess;
      env->spr_cb[0x3de].oea_read = spr_read_generic;
      env->spr_cb[0x3de].oea_write = spr_write_generic;
      env->spr_cb[0x3de].hea_read = spr_read_generic;
      env->spr_cb[0x3de].hea_write = spr_write_generic;
      env->spr_cb[0x3de].default_value = 0;
      env->spr[0x3de] = 0;
      if (((env->spr_cb[0x3db].name == (char *)0x0) && (env->spr[0x3db] == 0)) &&
         (((env->spr_cb[0x3db].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3db].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3db].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x3db].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x3db].name = "ESASRR";
        env->spr_cb[0x3db].uea_read = spr_noaccess;
        env->spr_cb[0x3db].uea_write = spr_noaccess;
        env->spr_cb[0x3db].oea_read = spr_read_generic;
        env->spr_cb[0x3db].oea_write = spr_write_generic;
        env->spr_cb[0x3db].hea_read = spr_read_generic;
        env->spr_cb[0x3db].hea_write = spr_write_generic;
        env->spr_cb[0x3db].default_value = 0;
        env->spr[0x3db] = 0;
        if (((((env->spr_cb[0x3fd].name == (char *)0x0) && (env->spr[0x3fd] == 0)) &&
             (env->spr_cb[0x3fd].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x3fd].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3fd].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x3fd].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x3fd].name = "SP";
          env->spr_cb[0x3fd].uea_read = spr_noaccess;
          env->spr_cb[0x3fd].uea_write = spr_noaccess;
          env->spr_cb[0x3fd].oea_read = spr_read_generic;
          env->spr_cb[0x3fd].oea_write = spr_write_generic;
          env->spr_cb[0x3fd].hea_read = spr_read_generic;
          env->spr_cb[0x3fd].hea_write = spr_write_generic;
          env->spr_cb[0x3fd].default_value = 0;
          env->spr[0x3fd] = 0;
          if (((env->spr_cb[0x3fe].name == (char *)0x0) && (env->spr[0x3fe] == 0)) &&
             ((env->spr_cb[0x3fe].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x3fe].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x3fe].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x3fe].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x3fe].name = "LT";
            env->spr_cb[0x3fe].uea_read = spr_noaccess;
            env->spr_cb[0x3fe].uea_write = spr_noaccess;
            env->spr_cb[0x3fe].oea_read = spr_read_generic;
            env->spr_cb[0x3fe].oea_write = spr_write_generic;
            env->spr_cb[0x3fe].hea_read = spr_read_generic;
            env->spr_cb[0x3fe].hea_write = spr_write_generic;
            env->spr_cb[0x3fe].default_value = 0;
            env->spr[0x3fe] = 0;
            if ((((env->spr_cb[0x3d8].name == (char *)0x0) && (env->spr[0x3d8] == 0)) &&
                ((env->spr_cb[0x3d8].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x3d8].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x3d8].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x3d8].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x3d8].name = "TCR";
              env->spr_cb[0x3d8].uea_read = spr_noaccess;
              env->spr_cb[0x3d8].uea_write = spr_noaccess;
              env->spr_cb[0x3d8].oea_read = spr_read_generic;
              env->spr_cb[0x3d8].oea_write = spr_write_generic;
              env->spr_cb[0x3d8].hea_read = spr_read_generic;
              env->spr_cb[0x3d8].hea_write = spr_write_generic;
              env->spr_cb[0x3d8].default_value = 0;
              env->spr[0x3d8] = 0;
              if ((((env->spr_cb[0x3da].name == (char *)0x0) && (env->spr[0x3da] == 0)) &&
                  (env->spr_cb[0x3da].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                 (((env->spr_cb[0x3da].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x3da].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  (env->spr_cb[0x3da].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                env->spr_cb[0x3da].name = "IBR";
                env->spr_cb[0x3da].uea_read = spr_noaccess;
                env->spr_cb[0x3da].uea_write = spr_noaccess;
                env->spr_cb[0x3da].oea_read = spr_read_generic;
                env->spr_cb[0x3da].oea_write = spr_write_generic;
                env->spr_cb[0x3da].hea_read = spr_read_generic;
                env->spr_cb[0x3da].hea_write = spr_write_generic;
                env->spr_cb[0x3da].default_value = 0;
                env->spr[0x3da] = 0;
                if (((env->spr_cb[0x3f2].name == (char *)0x0) && (env->spr[0x3f2] == 0)) &&
                   ((env->spr_cb[0x3f2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x3f2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x3f2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x3f2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x3f2].name = "IABR";
                  env->spr_cb[0x3f2].uea_read = spr_noaccess;
                  env->spr_cb[0x3f2].uea_write = spr_noaccess;
                  env->spr_cb[0x3f2].oea_read = spr_read_generic;
                  env->spr_cb[0x3f2].oea_write = spr_write_generic;
                  env->spr_cb[0x3f2].hea_read = spr_read_generic;
                  env->spr_cb[0x3f2].hea_write = spr_write_generic;
                  env->spr_cb[0x3f2].default_value = 0;
                  env->spr[0x3f2] = 0;
                  gen_tbl(env);
                  if (((env->spr_cb[0x3f0].name == (char *)0x0) && (env->spr[0x3f0] == 0)) &&
                     (((env->spr_cb[0x3f0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x3f0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x3f0].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x3f0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x3f0].name = "HID0";
                    env->spr_cb[0x3f0].uea_read = spr_noaccess;
                    env->spr_cb[0x3f0].uea_write = spr_noaccess;
                    env->spr_cb[0x3f0].oea_read = spr_read_generic;
                    env->spr_cb[0x3f0].oea_write = spr_write_generic;
                    env->spr_cb[0x3f0].hea_read = spr_read_generic;
                    env->spr_cb[0x3f0].hea_write = spr_write_generic;
                    env->spr_cb[0x3f0].default_value = 0;
                    env->spr[0x3f0] = 0;
                    if (((((env->spr_cb[0x3f1].name == (char *)0x0) && (env->spr[0x3f1] == 0)) &&
                         (env->spr_cb[0x3f1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)
                         ) && ((env->spr_cb[0x3f1].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x3f1].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                       (env->spr_cb[0x3f1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0))
                    {
                      env->spr_cb[0x3f1].name = "HID1";
                      env->spr_cb[0x3f1].uea_read = spr_noaccess;
                      env->spr_cb[0x3f1].uea_write = spr_noaccess;
                      env->spr_cb[0x3f1].oea_read = spr_read_generic;
                      env->spr_cb[0x3f1].oea_write = spr_write_generic;
                      env->spr_cb[0x3f1].hea_read = spr_read_generic;
                      env->spr_cb[0x3f1].hea_write = spr_write_generic;
                      env->spr_cb[0x3f1].default_value = 0;
                      env->spr[0x3f1] = 0;
                      gen_low_BATs(env);
                      gen_6xx_7xx_soft_tlb(env,in_ESI,nb_ways);
                      env->excp_vectors[0x40] = 0x100;
                      env->excp_vectors[1] = 0x200;
                      env->excp_vectors[2] = 0x300;
                      env->excp_vectors[3] = 0x400;
                      env->excp_vectors[4] = 0x500;
                      env->excp_vectors[5] = 0x600;
                      env->excp_vectors[6] = 0x700;
                      env->excp_vectors[7] = 0x800;
                      env->excp_vectors[10] = 0x900;
                      env->excp_vectors[8] = 0xc00;
                      env->excp_vectors[0x44] = 0xd00;
                      env->excp_vectors[0x4e] = 0x1000;
                      env->excp_vectors[0x4f] = 0x1100;
                      env->excp_vectors[0x50] = 0x1200;
                      env->excp_vectors[0x53] = 0x1300;
                      env->excp_vectors[0x54] = 0x1400;
                      env->excp_vectors[0xc] = 0x1500;
                      env->excp_vectors[0x4d] = 0x1600;
                      env->hreset_vector = 0x100;
                      env->dcache_line_size = 0x20;
                      env->icache_line_size = 0x20;
                      ppc6xx_irq_init_ppc64
                                ((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
                      return;
                    }
                    uVar2 = 0x3f1;
                    uVar1 = 0x3f1;
                  }
                  else {
                    uVar2 = 0x3f0;
                    uVar1 = 0x3f0;
                  }
                }
                else {
                  uVar2 = 0x3f2;
                  uVar1 = 0x3f2;
                }
              }
              else {
                uVar2 = 0x3da;
                uVar1 = 0x3da;
              }
            }
            else {
              uVar2 = 0x3d8;
              uVar1 = 0x3d8;
            }
          }
          else {
            uVar2 = 0x3fe;
            uVar1 = 0x3fe;
          }
        }
        else {
          uVar2 = 0x3fd;
          uVar1 = 0x3fd;
        }
      }
      else {
        uVar2 = 0x3db;
        uVar1 = 0x3db;
      }
    }
    else {
      uVar2 = 0x3de;
      uVar1 = 0x3de;
    }
  }
  else {
    uVar2 = 0x3df;
    uVar1 = 0x3df;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void init_proc_602(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_602(env);
    /* Time base */
    gen_tbl(env);
    /* hardware implementation registers */
    /* XXX : not implemented */
    spr_register(env, SPR_HID0, "HID0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID1, "HID1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Memory management */
    gen_low_BATs(env);
    gen_6xx_7xx_soft_tlb(env, 64, 2);
    init_excp_602(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}